

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

string * __thiscall
gl3cts::InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this,
          _test_iteration iteration)

{
  ostream *poVar1;
  TestError *this_00;
  char *local_400;
  char *local_3e8;
  char *local_3e0;
  string local_3c0 [32];
  stringstream local_3a0 [8];
  stringstream result_sstream_1;
  ostream local_390;
  string local_218 [8];
  string op_string;
  string local_1d8 [8];
  string type_string;
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  undefined1 local_1d;
  _test_iteration local_1c;
  InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *pIStack_18;
  _test_iteration iteration_local;
  InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this_local;
  string *result;
  
  local_1d = 0;
  local_1c = iteration;
  pIStack_18 = this;
  this_local = (InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (local_1c < TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__cxx11::string::string(local_1d8);
    if (local_1c == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2) {
      local_3e0 = "bvec2";
    }
    else {
      if (local_1c == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3) {
        local_3e8 = "mix_vec3_bvec3";
      }
      else {
        local_3e8 = "mix_vec4_bvec4";
      }
      local_3e8 = local_3e8 + 9;
      local_3e0 = local_3e8;
    }
    std::__cxx11::string::operator=(local_1d8,local_3e0);
    poVar1 = std::operator<<(&local_198,"#version 140\n\nvoid main()\n{\n    if (!");
    poVar1 = std::operator<<(poVar1,local_1d8);
    std::operator<<(poVar1,
                    "(false))\n    {\n        gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n    }\n    else\n    {\n        gl_Position = vec4(2.0, 3.0, 4.0, 5.0);\n    }\n}\n"
                   );
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)(op_string.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(op_string.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  else {
    if (1 < local_1c - TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized test iteration type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                 ,0x48b);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::string(local_218);
    std::__cxx11::stringstream::stringstream(local_3a0);
    if (local_1c == TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
      local_400 = "all";
    }
    else {
      local_400 = "not";
    }
    std::__cxx11::string::operator=(local_218,local_400);
    poVar1 = std::operator<<(&local_390,"#version 140\n\nvoid main()\n{\n    gl_Position = vec4(");
    poVar1 = std::operator<<(poVar1,local_218);
    std::operator<<(poVar1,"(false, true) ? 1.0 : 2.0);\n}\n");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_3c0);
    std::__cxx11::string::~string(local_3c0);
    std::__cxx11::stringstream::~stringstream(local_3a0);
    std::__cxx11::string::~string(local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getShaderBody(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2:
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3:
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC4:
	{
		/* From GL SL spec:
		 *
		 * The logical unary operator not (!). It operates only on a Boolean expression and results in a Boolean
		 * expression. To operate on a vector, use the built-in function not.
		 */
		std::stringstream result_sstream;
		std::string		  type_string;

		type_string = (iteration == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2) ?
						  "bvec2" :
						  (iteration == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3) ? "bvec3" : "bvec4";

		result_sstream << "#version 140\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    if (!"
					   << type_string << "(false))\n"
										 "    {\n"
										 "        gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
										 "    }\n"
										 "    else\n"
										 "    {\n"
										 "        gl_Position = vec4(2.0, 3.0, 4.0, 5.0);\n"
										 "    }\n"
										 "}\n";

		result = result_sstream.str();
		break;
	}

	case TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL:
	case TEST_ITERATION_NOT_FUNC_MUST_NOT_ACCEPT_BOOL:
	{
		std::string		  op_string;
		std::stringstream result_sstream;

		/* From GLSL spec, all() and not() functions are defined as:
		 *
		 * bool all(bvec x)
		 * bvec not(bvec x)
		 *
		 * where bvec is bvec2, bvec3 or bvec4.
		 */
		op_string = (iteration == TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) ? "all" : "not";

		result_sstream << "#version 140\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4("
					   << op_string << "(false, true) ? 1.0 : 2.0);\n"
									   "}\n";

		result = result_sstream.str();
		break;
	}

	default:
		TCU_FAIL("Unrecognized test iteration type");
	} /* switch (iteration) */

	return result;
}